

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void * prf_array_init(int initsize,int elemsize)

{
  int *piVar1;
  
  piVar1 = (int *)malloc((long)elemsize * (long)initsize + 8);
  *piVar1 = initsize;
  piVar1[1] = elemsize & 0xf;
  return piVar1 + 2;
}

Assistant:

void *
prf_array_init(int initsize, int elemsize)
{
  array *arr;

  arr = (array *)profit_malloc((size_t)initsize*elemsize+sizeof(array));
  assert( arr != NULL );
  
  arr->size = initsize;
  arr->elemsize = elemsize;
  arr->numelem = 0;
  
  return prf_array_to_id(arr);
}